

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  byte bVar3;
  ushort uVar4;
  byte *pbVar5;
  mz_uint8 (*pamVar6) [288];
  long lVar7;
  mz_uint16 (*pamVar8) [288];
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  mz_uint16 *pmVar13;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  mz_uint8 *pmVar21;
  mz_uint8 *pmVar22;
  byte bVar23;
  uint uVar24;
  byte *pbVar25;
  byte bVar26;
  uint uVar27;
  bool bVar28;
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar9 = 0x11f;
    lVar10 = 0x9067;
    do {
      if (lVar10 - 0x8f49U < 0x102) {
        iVar9 = 0x101;
        break;
      }
      iVar9 = iVar9 + -1;
      lVar7 = lVar10 + -0x14;
      lVar10 = lVar10 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar7) == '\0');
    iVar12 = 0x1f;
    lVar10 = 36999;
    do {
      if (lVar10 - 0x9069U < 2) {
        iVar12 = 1;
        break;
      }
      iVar12 = iVar12 + -1;
      lVar7 = lVar10 + -0x14;
      lVar10 = lVar10 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar7) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar9);
    memcpy(local_178 + iVar9,d->m_huff_code_sizes + 1,(long)iVar12);
    pamVar1 = d->m_huff_count + 2;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0xe) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x16) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1e) = 0;
    pamVar8 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar8 + 2) + 0x24) = 0;
    if (iVar12 + iVar9 == 0) {
      uVar24 = 0;
      uVar18 = 0xff;
      uVar16 = 0;
      uVar11 = 0;
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x12;
      uVar20 = 0;
      uVar11 = 0;
      uVar16 = 0;
      uVar24 = 0;
      uVar14 = 0xff;
      do {
        bVar23 = local_178[uVar20];
        uVar18 = (ulong)bVar23;
        bVar26 = (byte)uVar14;
        if (uVar18 == 0) {
          if (uVar24 != 0) {
            if (uVar24 < 3) {
              (*pamVar1)[uVar14] = (*pamVar1)[uVar14] + (short)uVar24;
              uVar27 = uVar11;
              do {
                uVar11 = uVar27 + 1;
                abStack_2b8[uVar27] = bVar26;
                uVar24 = uVar24 - 1;
                uVar27 = uVar11;
              } while (uVar24 != 0);
            }
            else {
              pmVar13 = d->m_huff_count[2] + 0x10;
              *pmVar13 = *pmVar13 + 1;
              uVar27 = uVar11 + 1;
              abStack_2b8[uVar11] = 0x10;
              uVar11 = uVar11 + 2;
              abStack_2b8[uVar27] = (char)uVar24 - 3;
            }
          }
          uVar16 = uVar16 + 1;
          if (uVar16 == 0x8a) {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar11] = 0x12;
            abStack_2b8[uVar11 + 1] = 0x7f;
LAB_0026cac6:
            uVar11 = uVar11 + 2;
            uVar24 = 0;
            goto LAB_0026cac9;
          }
          uVar24 = 0;
        }
        else {
          if (uVar16 != 0) {
            if (uVar16 < 3) {
              (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar16;
              uVar27 = uVar11;
              do {
                uVar11 = uVar27 + 1;
                abStack_2b8[uVar27] = 0;
                uVar16 = uVar16 - 1;
                uVar27 = uVar11;
              } while (uVar16 != 0);
            }
            else {
              bVar28 = uVar16 < 0xb;
              pmVar13 = pmVar2;
              if (bVar28) {
                pmVar13 = d->m_huff_count[2] + 0x11;
              }
              *pmVar13 = *pmVar13 + 1;
              abStack_2b8[uVar11] = 0x12 - bVar28;
              abStack_2b8[uVar11 + 1] = (bVar28 * '\b' + (char)uVar16) - 0xb;
              uVar11 = uVar11 + 2;
            }
          }
          if (bVar23 == bVar26) {
            uVar24 = uVar24 + 1;
            if (uVar24 == 6) {
              pmVar13 = d->m_huff_count[2] + 0x10;
              *pmVar13 = *pmVar13 + 1;
              abStack_2b8[uVar11] = 0x10;
              abStack_2b8[uVar11 + 1] = 3;
              goto LAB_0026cac6;
            }
LAB_0026cac9:
            uVar16 = 0;
          }
          else {
            if (uVar24 != 0) {
              if (uVar24 < 3) {
                (*pamVar1)[uVar14] = (*pamVar1)[uVar14] + (short)uVar24;
                uVar16 = uVar11;
                do {
                  uVar11 = uVar16 + 1;
                  abStack_2b8[uVar16] = bVar26;
                  uVar24 = uVar24 - 1;
                  uVar16 = uVar11;
                } while (uVar24 != 0);
              }
              else {
                pmVar13 = d->m_huff_count[2] + 0x10;
                *pmVar13 = *pmVar13 + 1;
                uVar16 = uVar11 + 1;
                abStack_2b8[uVar11] = 0x10;
                uVar11 = uVar11 + 2;
                abStack_2b8[uVar16] = (char)uVar24 - 3;
              }
            }
            uVar14 = (ulong)uVar11;
            (*pamVar1)[uVar18] = (*pamVar1)[uVar18] + 1;
            uVar11 = uVar11 + 1;
            abStack_2b8[uVar14] = bVar23;
            uVar24 = 0;
            uVar16 = 0;
          }
        }
        uVar20 = uVar20 + 1;
        uVar14 = uVar18;
      } while (uVar20 != (uint)(iVar12 + iVar9));
    }
    if (uVar24 == 0) {
      if (uVar16 != 0) {
        if (uVar16 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar16;
          uVar24 = uVar11;
          do {
            uVar11 = uVar24 + 1;
            abStack_2b8[uVar24] = 0;
            uVar16 = uVar16 - 1;
            uVar24 = uVar11;
          } while (uVar16 != 0);
        }
        else {
          if (uVar16 < 0xb) {
            pmVar2 = d->m_huff_count[2] + 0x11;
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar11] = 0x11;
            bVar23 = (char)uVar16 - 3;
          }
          else {
            pmVar2 = d->m_huff_count[2] + 0x12;
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar11] = 0x12;
            bVar23 = (char)uVar16 - 0xb;
          }
          abStack_2b8[uVar11 + 1] = bVar23;
          uVar11 = uVar11 + 2;
        }
      }
    }
    else if (uVar24 < 3) {
      (*pamVar1)[uVar18] = (*pamVar1)[uVar18] + (short)uVar24;
      uVar16 = uVar11;
      do {
        uVar11 = uVar16 + 1;
        abStack_2b8[uVar16] = (byte)uVar18;
        uVar24 = uVar24 - 1;
        uVar16 = uVar11;
      } while (uVar24 != 0);
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar16 = uVar11 + 1;
      abStack_2b8[uVar11] = 0x10;
      uVar11 = uVar11 + 2;
      abStack_2b8[uVar16] = (char)uVar24 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    d->m_bit_buffer = d->m_bit_buffer | 2 << ((byte)d->m_bits_in & 0x1f);
    uVar24 = d->m_bits_in + 2;
    d->m_bits_in = uVar24;
    while (7 < uVar24) {
      pmVar22 = d->m_pOutput_buf;
      if (pmVar22 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar22 + 1;
        *pmVar22 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar24 = d->m_bits_in - 8;
      d->m_bits_in = uVar24;
    }
    if (0x1f < iVar9 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x416,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar9 - 0x101U << ((byte)uVar24 & 0x1f);
    uVar16 = uVar24 + 5;
    d->m_bits_in = uVar16;
    if (2 < uVar24) {
      do {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar16 = d->m_bits_in - 8;
        d->m_bits_in = uVar16;
      } while (7 < uVar16);
    }
    if (0x1f < iVar12 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x417,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar12 - 1U << ((byte)uVar16 & 0x1f);
    uVar24 = uVar16 + 5;
    d->m_bits_in = uVar24;
    if (2 < uVar16) {
      do {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar24 = d->m_bits_in - 8;
        d->m_bits_in = uVar24;
      } while (7 < uVar24);
    }
    uVar18 = 0x12;
    do {
      iVar9 = (int)uVar18;
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar18]] != '\0') goto LAB_0026cce7;
      uVar18 = (ulong)(iVar9 - 1);
    } while (iVar9 != 0);
    iVar9 = -1;
LAB_0026cce7:
    iVar12 = 3;
    if (3 < iVar9) {
      iVar12 = iVar9;
    }
    if (0xf < iVar12 - 3U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x41d,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar12 - 3U << ((byte)uVar24 & 0x1f);
    d->m_bits_in = uVar24 + 4;
    if (3 < uVar24) {
      do {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar24 = d->m_bits_in - 8;
        d->m_bits_in = uVar24;
      } while (7 < uVar24);
    }
    uVar18 = 0;
    do {
      uVar24 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar18]];
      if (7 < uVar24) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x41f,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      d->m_bit_buffer = d->m_bit_buffer | uVar24 << ((byte)d->m_bits_in & 0x1f);
      uVar24 = d->m_bits_in + 3;
      d->m_bits_in = uVar24;
      while (7 < uVar24) {
        pmVar22 = d->m_pOutput_buf;
        if (pmVar22 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar22 + 1;
          *pmVar22 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar24 = d->m_bits_in - 8;
        d->m_bits_in = uVar24;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != iVar12 + 1);
    if (uVar11 != 0) {
      uVar18 = 0;
      do {
        bVar23 = abStack_2b8[uVar18];
        uVar14 = (ulong)bVar23;
        if (0x12 < uVar14) {
          __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x424,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar4 = d->m_huff_codes[2][uVar14];
        bVar26 = d->m_huff_code_sizes[2][uVar14];
        if (uVar4 >> (bVar26 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x425,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)d->m_bits_in & 0x1f);
        uVar24 = (uint)bVar26 + d->m_bits_in;
        d->m_bits_in = uVar24;
        while (7 < uVar24) {
          pmVar22 = d->m_pOutput_buf;
          if (pmVar22 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar22 + 1;
            *pmVar22 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar24 = d->m_bits_in - 8;
          d->m_bits_in = uVar24;
        }
        uVar16 = (int)uVar18 + 1;
        if (0xf < bVar23) {
          bVar23 = "\x02\x03\a"[bVar23 - 0x10];
          if (abStack_2b8[uVar16] >> (bVar23 & 0x1f) != 0) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                          ,0x427,"void tdefl_start_dynamic_block(tdefl_compressor *)");
          }
          d->m_bit_buffer = d->m_bit_buffer | (uint)abStack_2b8[uVar16] << ((byte)uVar24 & 0x1f);
          uVar16 = (int)uVar18 + 2;
          uVar24 = (int)(char)bVar23 + uVar24;
          d->m_bits_in = uVar24;
          while (7 < uVar24) {
            pmVar22 = d->m_pOutput_buf;
            if (pmVar22 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar22 + 1;
              *pmVar22 = (mz_uint8)d->m_bit_buffer;
            }
            d->m_bit_buffer = d->m_bit_buffer >> 8;
            uVar24 = d->m_bits_in - 8;
            d->m_bits_in = uVar24;
          }
        }
        uVar18 = (ulong)uVar16;
      } while (uVar16 < uVar11);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar6 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar6 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0xf) = '\x05';
    pamVar6 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x17) = '\x05';
    pamVar6 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar6 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    d->m_bit_buffer = d->m_bit_buffer | 1 << ((byte)d->m_bits_in & 0x1f);
    uVar11 = d->m_bits_in + 2;
    d->m_bits_in = uVar11;
    while (7 < uVar11) {
      pmVar22 = d->m_pOutput_buf;
      if (pmVar22 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar22 + 1;
        *pmVar22 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar11 = d->m_bits_in - 8;
      d->m_bits_in = uVar11;
    }
  }
  pbVar5 = d->m_pLZ_code_buf;
  puVar19 = (ulong *)d->m_pOutput_buf;
  uVar18 = (ulong)d->m_bit_buffer;
  uVar11 = d->m_bits_in;
  pmVar22 = d->m_lz_code_buf;
  if (pmVar22 < pbVar5) {
    uVar24 = 1;
    do {
      pmVar21 = pmVar22;
      if (uVar24 == 1) {
        pmVar21 = pmVar22 + 1;
        uVar24 = *pmVar22 | 0x100;
      }
      uVar16 = uVar24;
      if ((uVar24 & 1) == 0) {
        bVar23 = d->m_huff_code_sizes[0][*pmVar21];
        if (bVar23 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x472,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar22 = pmVar21 + 1;
        uVar18 = (ulong)d->m_huff_codes[0][*pmVar21] << ((byte)uVar11 & 0x3f) | uVar18;
        uVar11 = bVar23 + uVar11;
        if (((uVar24 & 2) == 0) && (pmVar22 < pbVar5)) {
          bVar23 = d->m_huff_code_sizes[0][pmVar21[1]];
          if (bVar23 == 0) {
            __assert_fail("d->m_huff_code_sizes[0][lit]",
                          "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                          ,0x479,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
          }
          pmVar22 = pmVar21 + 2;
          uVar16 = uVar24 >> 1;
          uVar18 = uVar18 | (ulong)d->m_huff_codes[0][pmVar21[1]] << ((byte)uVar11 & 0x3f);
          uVar11 = uVar11 + bVar23;
          if (((uVar24 & 4) == 0) && (pmVar22 < pbVar5)) {
            bVar23 = *pmVar22;
            bVar26 = d->m_huff_code_sizes[0][bVar23];
            if (bVar26 == 0) {
              __assert_fail("d->m_huff_code_sizes[0][lit]",
                            "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                            ,0x480,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
            }
            pmVar22 = pmVar21 + 3;
            uVar18 = uVar18 | (ulong)d->m_huff_codes[0][bVar23] << ((byte)uVar11 & 0x3f);
            uVar11 = uVar11 + bVar26;
            uVar16 = uVar24 >> 2;
          }
        }
      }
      else {
        bVar23 = *pmVar21;
        bVar26 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar23]];
        if (bVar26 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x45f,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        uVar4 = *(ushort *)(pmVar21 + 1);
        pbVar15 = "" + (uVar4 >> 8);
        if (uVar4 < 0x200) {
          pbVar15 = "" + (uVar4 & 0x1ff);
        }
        bVar3 = d->m_huff_code_sizes[1][*pbVar15];
        if (bVar3 == 0) {
          __assert_fail("d->m_huff_code_sizes[1][sym]",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x46b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar22 = pmVar21 + 3;
        pbVar25 = "" + (uVar4 & 0x1ff);
        if (0x1ff < uVar4) {
          pbVar25 = "" + (uVar4 >> 8);
        }
        iVar17 = bVar26 + uVar11;
        iVar12 = iVar17 + (uint)""[bVar23];
        iVar9 = (uint)bVar3 + iVar12;
        uVar18 = (ulong)((uint)uVar4 & mz_bitmasks[*pbVar25]) << ((byte)iVar9 & 0x3f) |
                 (ulong)d->m_huff_codes[1][*pbVar15] << ((byte)iVar12 & 0x3f) |
                 (ulong)d->m_huff_codes[0][s_tdefl_len_sym[bVar23]] << ((byte)uVar11 & 0x3f) |
                 (ulong)((uint)bVar23 & mz_bitmasks[""[bVar23]]) << ((byte)iVar17 & 0x3f) | uVar18;
        uVar11 = iVar9 + (uint)*pbVar25;
      }
      if (d->m_pOutput_buf_end <= puVar19) {
        return 0;
      }
      *puVar19 = uVar18;
      puVar19 = (ulong *)((long)puVar19 + (ulong)(uVar11 >> 3));
      uVar18 = uVar18 >> ((byte)uVar11 & 0x38);
      uVar11 = uVar11 & 7;
      uVar24 = uVar16 >> 1;
    } while (pmVar22 < pbVar5);
  }
  d->m_pOutput_buf = (mz_uint8 *)puVar19;
  d->m_bits_in = 0;
  d->m_bit_buffer = 0;
  while( true ) {
    if (uVar11 == 0) {
      uVar4 = d->m_huff_codes[0][0x100];
      bVar23 = d->m_huff_code_sizes[0][0x100];
      if (uVar4 >> (bVar23 & 0x1f) == 0) {
        d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)d->m_bits_in & 0x1f);
        uVar11 = (uint)bVar23 + d->m_bits_in;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar22 = d->m_pOutput_buf;
          if (pmVar22 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar22 + 1;
            *pmVar22 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
        return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
      }
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x49d,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
    }
    uVar14 = 0x10;
    if (uVar11 < 0x10) {
      uVar14 = (ulong)uVar11;
    }
    uVar24 = mz_bitmasks[uVar14] & (uint)uVar18;
    if (uVar24 >> ((byte)uVar14 & 0x1f) != 0) break;
    d->m_bit_buffer = d->m_bit_buffer | uVar24 << ((byte)d->m_bits_in & 0x1f);
    uVar24 = d->m_bits_in + (int)uVar14;
    d->m_bits_in = uVar24;
    while (7 < uVar24) {
      pmVar22 = d->m_pOutput_buf;
      if (pmVar22 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar22 + 1;
        *pmVar22 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar24 = d->m_bits_in - 8;
      d->m_bits_in = uVar24;
    }
    uVar18 = uVar18 >> ((byte)uVar14 & 0x3f);
    uVar11 = uVar11 - (int)uVar14;
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                ,0x498,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block)
{
    if (static_block)
        tdefl_start_static_block(d);
    else
        tdefl_start_dynamic_block(d);
    return tdefl_compress_lz_codes(d);
}